

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canBzip2(void)

{
  wchar_t wVar1;
  
  if (canBzip2::tested == L'\0') {
    canBzip2::tested = L'\x01';
    wVar1 = systemf("bzip2 --help %s",redirectArgs);
    if (wVar1 == L'\0') {
      canBzip2::value = L'\x01';
    }
  }
  return canBzip2::value;
}

Assistant:

int
canBzip2(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("bzip2 --help %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}